

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modes.c
# Opt level: O2

int notabmode(int f,int n)

{
  int iVar1;
  byte bVar2;
  
  iVar1 = changemode(f,n,"notab");
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    if ((f & 7U) == 0) {
      curbp->b_flag = curbp->b_flag ^ 4;
    }
    else {
      if (n < 1) {
        bVar2 = curbp->b_flag & 0xfb;
      }
      else {
        bVar2 = curbp->b_flag | 4;
      }
      curbp->b_flag = bVar2;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int
notabmode(int f, int n)
{
	if (changemode(f, n, "notab") == FALSE)
		return (FALSE);
	if (f & FFARG) {
		if (n <= 0)
			curbp->b_flag &= ~BFNOTAB;
		else
			curbp->b_flag |= BFNOTAB;
	} else
		curbp->b_flag ^= BFNOTAB;
	return (TRUE);
}